

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O0

MaskImage * __thiscall
DataSourceCustom::get_sprite_parts
          (MaskImage *__return_storage_ptr__,DataSourceCustom *this,Resource res,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *def_val;
  _Setfill<char> _Var1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  element_type *peVar5;
  ulong uVar6;
  element_type *peVar7;
  tuple<std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>_> local_4a0;
  shared_ptr<SpriteFile> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  shared_ptr<SpriteFile> local_430;
  undefined1 local_420 [8];
  PSpriteFile mask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  shared_ptr<SpriteFile> local_3c0;
  undefined1 local_3b0 [8];
  PSpriteFile image;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  string mask_file_name;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  string image_file_name;
  string local_2c8;
  int local_2a4;
  int local_2a0;
  int offset_y;
  string local_298;
  int local_274;
  int local_270;
  int offset_x;
  string local_268;
  int local_244;
  int local_240;
  int delta_y;
  string local_238;
  int local_214;
  undefined1 local_210 [4];
  int delta_x;
  string section;
  stringstream local_1d8 [8];
  stringstream stream;
  undefined1 local_1c8 [376];
  undefined8 local_50;
  void *local_48;
  tuple<std::nullptr_t,_std::nullptr_t> local_40;
  ResInfo *local_30;
  ResInfo *info;
  size_t index_local;
  DataSourceCustom *pDStack_18;
  Resource res_local;
  DataSourceCustom *this_local;
  
  info = (ResInfo *)index;
  index_local._4_4_ = res;
  pDStack_18 = this;
  this_local = (DataSourceCustom *)__return_storage_ptr__;
  local_30 = get_info(this,res);
  if (local_30 == (ResInfo *)0x0) {
    local_48 = (void *)0x0;
    local_50 = 0;
    std::make_tuple<decltype(nullptr),decltype(nullptr)>((void **)&local_40,&local_48);
    std::tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>::
    tuple<std::nullptr_t,_std::nullptr_t,_true>(__return_storage_ptr__,&local_40);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1d8);
    _Var1 = std::setfill<char>('0');
    poVar4 = std::operator<<(local_1c8,_Var1._M_c);
    section.field_2._8_4_ = std::setw(3);
    poVar4 = std::operator<<(poVar4,(_Setw)section.field_2._8_4_);
    std::ostream::operator<<(poVar4,(ulong)info);
    std::__cxx11::stringstream::str();
    peVar5 = std::__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"delta_x",(allocator<char> *)((long)&delta_y + 3));
    local_240 = 0;
    iVar3 = ConfigFile::value<int>(peVar5,(string *)local_210,&local_238,&local_240);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)((long)&delta_y + 3));
    local_214 = iVar3;
    peVar5 = std::__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"delta_y",(allocator<char> *)((long)&offset_x + 3));
    local_270 = 0;
    iVar3 = ConfigFile::value<int>(peVar5,(string *)local_210,&local_268,&local_270);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)((long)&offset_x + 3));
    local_244 = iVar3;
    peVar5 = std::__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"offset_x",(allocator<char> *)((long)&offset_y + 3));
    local_2a0 = 0;
    iVar3 = ConfigFile::value<int>(peVar5,(string *)local_210,&local_298,&local_2a0);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)((long)&offset_y + 3));
    local_274 = iVar3;
    peVar5 = std::__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"offset_y",
               (allocator<char> *)(image_file_name.field_2._M_local_buf + 0xf));
    image_file_name.field_2._8_4_ = 0;
    iVar3 = ConfigFile::value<int>
                      (peVar5,(string *)local_210,&local_2c8,
                       (int *)(image_file_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(image_file_name.field_2._M_local_buf + 0xf));
    local_2a4 = iVar3;
    peVar5 = std::__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"image_path",&local_311)
    ;
    std::__cxx11::string::string((string *)(mask_file_name.field_2._M_local_buf + 8));
    ConfigFile::value((string *)local_2f0,peVar5,(string *)local_210,&local_310,
                      (string *)(mask_file_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(mask_file_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    peVar5 = std::__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ConfigFile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"mask_path",&local_379);
    def_val = &image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::string((string *)def_val);
    ConfigFile::value((string *)local_358,peVar5,(string *)local_210,&local_378,(string *)def_val);
    std::__cxx11::string::~string
              ((string *)
               &image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    std::shared_ptr<SpriteFile>::shared_ptr((shared_ptr<SpriteFile> *)local_3b0);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::make_shared<SpriteFile>();
      std::shared_ptr<SpriteFile>::operator=((shared_ptr<SpriteFile> *)local_3b0,&local_3c0);
      std::shared_ptr<SpriteFile>::~shared_ptr(&local_3c0);
      peVar7 = std::__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_3b0);
      std::operator+(&local_400,&local_30->path,"/");
      std::operator+(&local_3e0,&local_400,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0)
      ;
      bVar2 = SpriteFile::load(peVar7,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_3b0);
        SpriteFile::set_delta(peVar7,local_214,local_244);
        peVar7 = std::__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_3b0);
        SpriteFile::set_offset(peVar7,local_274,local_2a4);
      }
      else {
        std::shared_ptr<SpriteFile>::shared_ptr
                  ((shared_ptr<SpriteFile> *)
                   &mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (nullptr_t)0x0);
        std::shared_ptr<SpriteFile>::operator=
                  ((shared_ptr<SpriteFile> *)local_3b0,
                   (shared_ptr<SpriteFile> *)
                   &mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<SpriteFile>::~shared_ptr
                  ((shared_ptr<SpriteFile> *)
                   &mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    std::shared_ptr<SpriteFile>::shared_ptr((shared_ptr<SpriteFile> *)local_420);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::make_shared<SpriteFile>();
      std::shared_ptr<SpriteFile>::operator=((shared_ptr<SpriteFile> *)local_420,&local_430);
      std::shared_ptr<SpriteFile>::~shared_ptr(&local_430);
      peVar7 = std::__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_420);
      std::operator+(&local_470,&local_30->path,"/");
      std::operator+(&local_450,&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358)
      ;
      bVar2 = SpriteFile::load(peVar7,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_420);
        SpriteFile::set_delta(peVar7,local_214,local_244);
        peVar7 = std::__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SpriteFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_420);
        SpriteFile::set_offset(peVar7,local_274,local_2a4);
      }
      else {
        std::shared_ptr<SpriteFile>::shared_ptr(&local_480,(nullptr_t)0x0);
        std::shared_ptr<SpriteFile>::operator=((shared_ptr<SpriteFile> *)local_420,&local_480);
        std::shared_ptr<SpriteFile>::~shared_ptr(&local_480);
      }
    }
    std::make_tuple<std::shared_ptr<SpriteFile>&,std::shared_ptr<SpriteFile>&>
              (&local_4a0,(shared_ptr<SpriteFile> *)local_420,(shared_ptr<SpriteFile> *)local_3b0);
    std::tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>::
    tuple<std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>,_true>
              (__return_storage_ptr__,&local_4a0);
    std::tuple<std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>_>::~tuple(&local_4a0);
    std::shared_ptr<SpriteFile>::~shared_ptr((shared_ptr<SpriteFile> *)local_420);
    std::shared_ptr<SpriteFile>::~shared_ptr((shared_ptr<SpriteFile> *)local_3b0);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string((string *)local_2f0);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Data::MaskImage
DataSourceCustom::get_sprite_parts(Data::Resource res, size_t index) {
  ResInfo *info = get_info(res);
  if (info == nullptr) {
    return std::make_tuple(nullptr, nullptr);
  }

  std::stringstream stream;
  stream << std::setfill('0') << std::setw(3) << index;
  std::string section = stream.str();

  int delta_x = info->meta->value(section, "delta_x", 0);
  int delta_y = info->meta->value(section, "delta_y", 0);
  int offset_x = info->meta->value(section, "offset_x", 0);
  int offset_y = info->meta->value(section, "offset_y", 0);
  std::string image_file_name = info->meta->value(section,
                                                  "image_path",
                                                  std::string());
  std::string mask_file_name = info->meta->value(section,
                                                 "mask_path",
                                                 std::string());

  PSpriteFile image;
  if (!image_file_name.empty()) {
    image = std::make_shared<SpriteFile>();
    if (image->load(info->path + "/" + image_file_name)) {
      image->set_delta(delta_x, delta_y);
      image->set_offset(offset_x, offset_y);
    } else {
      image = nullptr;
    }
  }

  PSpriteFile mask;
  if (!mask_file_name.empty()) {
    mask = std::make_shared<SpriteFile>();
    if (mask->load(info->path + "/" + mask_file_name)) {
      mask->set_delta(delta_x, delta_y);
      mask->set_offset(offset_x, offset_y);
    } else {
      mask = nullptr;
    }
  }

  return std::make_tuple(mask, image);
}